

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TarjanAnalysis.h
# Opt level: O2

void __thiscall
dg::llvmdg::legacy::TarjanAnalysis<dg::llvmdg::legacy::Block>::~TarjanAnalysis
          (TarjanAnalysis<dg::llvmdg::legacy::Block> *this)

{
  StronglyConnectedComponent *this_00;
  _Base_ptr p_Var1;
  
  for (p_Var1 = (this->components_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(this->components_)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1)) {
    this_00 = *(StronglyConnectedComponent **)(p_Var1 + 1);
    if (this_00 != (StronglyConnectedComponent *)0x0) {
      StronglyConnectedComponent::~StronglyConnectedComponent(this_00);
    }
    operator_delete(this_00,0x80);
  }
  std::
  _Rb_tree<dg::llvmdg::legacy::TarjanAnalysis<dg::llvmdg::legacy::Block>::StronglyConnectedComponent_*,_dg::llvmdg::legacy::TarjanAnalysis<dg::llvmdg::legacy::Block>::StronglyConnectedComponent_*,_std::_Identity<dg::llvmdg::legacy::TarjanAnalysis<dg::llvmdg::legacy::Block>::StronglyConnectedComponent_*>,_std::less<dg::llvmdg::legacy::TarjanAnalysis<dg::llvmdg::legacy::Block>::StronglyConnectedComponent_*>,_std::allocator<dg::llvmdg::legacy::TarjanAnalysis<dg::llvmdg::legacy::Block>::StronglyConnectedComponent_*>_>
  ::~_Rb_tree(&(this->components_)._M_t);
  std::
  _Hashtable<dg::llvmdg::legacy::Block_*,_std::pair<dg::llvmdg::legacy::Block_*const,_dg::llvmdg::legacy::TarjanAnalysis<dg::llvmdg::legacy::Block>::Node>,_std::allocator<std::pair<dg::llvmdg::legacy::Block_*const,_dg::llvmdg::legacy::TarjanAnalysis<dg::llvmdg::legacy::Block>::Node>_>,_std::__detail::_Select1st,_std::equal_to<dg::llvmdg::legacy::Block_*>,_std::hash<dg::llvmdg::legacy::Block_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&(this->nodeInfo)._M_h);
  std::_Deque_base<dg::llvmdg::legacy::Block_*,_std::allocator<dg::llvmdg::legacy::Block_*>_>::
  ~_Deque_base((_Deque_base<dg::llvmdg::legacy::Block_*,_std::allocator<dg::llvmdg::legacy::Block_*>_>
                *)&this->stack);
  return;
}

Assistant:

~TarjanAnalysis() {
        for (auto component : components_) {
            delete component;
        }
    }